

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

errr finish_parse_artifact(parser *p)

{
  artifact *paVar1;
  wchar_t tval;
  wchar_t wVar2;
  artifact *local_30;
  uint32_t local_28;
  wchar_t aidx;
  wchar_t none;
  artifact *n;
  artifact *a;
  parser *p_local;
  
  z_info->a_max = 0;
  for (n = (artifact *)parser_priv(p); n != (artifact *)0x0; n = n->next) {
    z_info->a_max = z_info->a_max + 1;
  }
  a_info = (artifact *)mem_zalloc((long)(int)(z_info->a_max + 1) * 0x140);
  aup_info = (artifact_upkeep *)mem_zalloc((long)(int)(z_info->a_max + 1) << 3);
  local_28 = (uint32_t)z_info->a_max;
  n = (artifact *)parser_priv(p);
  while( true ) {
    if (n == (artifact *)0x0) {
      z_info->a_max = z_info->a_max + 1;
      tval = tval_find_idx("none");
      wVar2 = lookup_sval(tval,"<unknown item>");
      unknown_item_kind = lookup_kind(tval,wVar2);
      wVar2 = lookup_sval(tval,"<unknown treasure>");
      unknown_gold_kind = lookup_kind(tval,wVar2);
      wVar2 = lookup_sval(tval,"<pile>");
      pile_kind = lookup_kind(tval,wVar2);
      wVar2 = lookup_sval(tval,"<curse object>");
      curse_object_kind = lookup_kind(tval,wVar2);
      write_curse_kinds();
      parser_destroy(p);
      return 0;
    }
    if ((int)local_28 < 1) break;
    memcpy(a_info + (int)local_28,n,0x140);
    a_info[(int)local_28].aidx = local_28;
    paVar1 = n->next;
    if ((int)local_28 < (int)(uint)z_info->a_max) {
      local_30 = a_info + (int)(local_28 + 1);
    }
    else {
      local_30 = (artifact *)0x0;
    }
    a_info[(int)local_28].next = local_30;
    mem_free(n);
    aup_info[(int)local_28].aidx = local_28;
    local_28 = local_28 - 1;
    n = paVar1;
  }
  __assert_fail("aidx > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-init.c"
                ,0xbff,"errr finish_parse_artifact(struct parser *)");
}

Assistant:

static errr finish_parse_artifact(struct parser *p) {
	struct artifact *a, *n;
	int none, aidx;

	/* Scan the list for the max id */
	z_info->a_max = 0;
	a = parser_priv(p);
	while (a) {
		z_info->a_max++;
		a = a->next;
	}

	/* Allocate the direct access list and copy the data to it */
	a_info = mem_zalloc((z_info->a_max + 1) * sizeof(*a));
	aup_info = mem_zalloc((z_info->a_max + 1) * sizeof(*aup_info));
	aidx = z_info->a_max;
	for (a = parser_priv(p); a; a = n, aidx--) {
		assert(aidx > 0);

		memcpy(&a_info[aidx], a, sizeof(*a));
		a_info[aidx].aidx = aidx;
		n = a->next;
		a_info[aidx].next = (aidx < z_info->a_max) ?
			&a_info[aidx + 1] : NULL;
		mem_free(a);

		aup_info[aidx].aidx = aidx;
	}
	z_info->a_max += 1;

	/* Now we're done with object kinds, deal with object-like things */
	none = tval_find_idx("none");
	unknown_item_kind = lookup_kind(none, lookup_sval(none, "<unknown item>"));
	unknown_gold_kind = lookup_kind(none,
									lookup_sval(none, "<unknown treasure>"));
	pile_kind = lookup_kind(none, lookup_sval(none, "<pile>"));
	curse_object_kind = lookup_kind(none, lookup_sval(none, "<curse object>"));
	write_curse_kinds();
	parser_destroy(p);
	return 0;
}